

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_wd_default(lyd_node_leaf_list *node)

{
  lys_node *plVar1;
  byte local_4b;
  byte local_4a;
  byte local_49;
  uint8_t i;
  uint8_t c;
  lys_node *plStack_48;
  uint8_t dflts_size;
  char **dflts;
  char *dflt;
  lys_tpdf *tpdf;
  lyd_node *iter;
  lys_node_leaflist *llist;
  lys_node_leaf *leaf;
  lyd_node_leaf_list *node_local;
  
  dflts = (char **)0x0;
  plStack_48 = (lys_node *)0x0;
  local_49 = 0;
  if ((node == (lyd_node_leaf_list *)0x0) ||
     ((node->schema->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)) {
    node_local._4_4_ = 0;
  }
  else if ((node->field_0x9 & 1) == 0) {
    if (node->schema->nodetype == LYS_LEAF) {
      plVar1 = node->schema;
      if (plVar1[1].prev == (lys_node *)0x0) {
        if ((plVar1->flags & 0x40) == 0) {
          for (dflt = (char *)plVar1[1].iffeature; dflt != (char *)0x0 && dflts == (char **)0x0;
              dflt = *(char **)(dflt + 0x50)) {
            dflts = *(char ***)(dflt + 0x78);
          }
        }
      }
      else {
        dflts = &(plVar1[1].prev)->name;
      }
      if (dflts == (char **)0x0) {
        return 0;
      }
      if (dflts != (char **)node->value_str) {
        return 0;
      }
    }
    else {
      if (((byte)node->schema->module->field_0x40 >> 1 & 7) < 2) {
        return 0;
      }
      plVar1 = node->schema;
      if (plVar1->padding[2] == '\0') {
        if (*(int *)&plVar1[1].priv == 0) {
          for (dflt = (char *)plVar1[1].iffeature; dflt != (char *)0x0;
              dflt = *(char **)(dflt + 0x50)) {
            if (*(long *)(dflt + 0x78) != 0) {
              plStack_48 = (lys_node *)(dflt + 0x78);
              local_49 = 1;
              break;
            }
          }
        }
      }
      else {
        local_49 = plVar1->padding[2];
        plStack_48 = plVar1[1].prev;
      }
      if (local_49 == 0) {
        return 0;
      }
      tpdf = (lys_tpdf *)node;
      if (node->parent == (lyd_node *)0x0) {
        while (tpdf->ext[3] != (lys_ext_instance *)0x0) {
          tpdf = (lys_tpdf *)tpdf->ext;
        }
      }
      else {
        tpdf = (lys_tpdf *)node->parent->child;
      }
      local_4a = 0;
      for (; tpdf != (lys_tpdf *)0x0; tpdf = *(lys_tpdf **)&tpdf->flags) {
        if ((lys_node *)tpdf->name == node->schema) {
          if (local_4a == local_49) {
            return 0;
          }
          if ((plVar1->flags & 0x100) == 0) {
            local_4b = 0;
            while ((local_4b < local_49 &&
                   (*(lys_module **)(plStack_48->padding + (ulong)local_4b * 8 + -0x1c) !=
                    tpdf->module))) {
              local_4b = local_4b + 1;
            }
            if (local_4b == local_49) {
              return 0;
            }
          }
          else if (*(lys_module **)(plStack_48->padding + (ulong)local_4a * 8 + -0x1c) !=
                   tpdf->module) {
            return 0;
          }
          local_4a = local_4a + 1;
        }
      }
      if (local_4a != local_49) {
        return 0;
      }
    }
    node_local._4_4_ = 1;
  }
  else {
    node_local._4_4_ = 1;
  }
  return node_local._4_4_;
}

Assistant:

API int
lyd_wd_default(struct lyd_node_leaf_list *node)
{
    struct lys_node_leaf *leaf;
    struct lys_node_leaflist *llist;
    struct lyd_node *iter;
    struct lys_tpdf *tpdf;
    const char *dflt = NULL, **dflts = NULL;
    uint8_t dflts_size = 0, c, i;

    if (!node || !(node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
        return 0;
    }

    if (node->dflt) {
        return 1;
    }

    if (node->schema->nodetype == LYS_LEAF) {
        leaf = (struct lys_node_leaf*)node->schema;

        /* get know if there is a default value */
        if (leaf->dflt) {
            /* leaf has a default value */
            dflt = leaf->dflt;
        } else if (!(leaf->flags & LYS_MAND_TRUE)) {
            /* get the default value from the type */
            for (tpdf = leaf->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
                dflt = tpdf->dflt;
            }
        }
        if (!dflt) {
            /* no default value */
            return 0;
        }

        /* compare the default value with the value of the leaf */
        if (!ly_strequal(dflt, node->value_str, 1)) {
            return 0;
        }
    } else if (node->schema->module->version >= 2) { /* LYS_LEAFLIST */
        llist = (struct lys_node_leaflist*)node->schema;

        /* get know if there is a default value */
        if (llist->dflt_size) {
            /* there are default values */
            dflts_size = llist->dflt_size;
            dflts = llist->dflt;
        } else if (!llist->min) {
            /* get the default value from the type */
            for (tpdf = llist->type.der; tpdf && !dflts; tpdf = tpdf->type.der) {
                if (tpdf->dflt) {
                    dflts = &tpdf->dflt;
                    dflts_size = 1;
                    break;
                }
            }
        }

        if (!dflts_size) {
            /* no default values to use */
            return 0;
        }

        /* compare the default value with the value of the leaf */
        /* first, find the first leaf-list's sibling */
        iter = (struct lyd_node *)node;
        if (iter->parent) {
            iter = iter->parent->child;
        } else {
            for (; iter->prev->next; iter = iter->prev);
        }
        for (c = 0; iter; iter = iter->next) {
            if (iter->schema != node->schema) {
                continue;
            }
            if (c == dflts_size) {
                /* to many leaf-list instances */
                return 0;
            }

            if (llist->flags & LYS_USERORDERED) {
                /* we have strict order */
                if (!ly_strequal(dflts[c], ((struct lyd_node_leaf_list *)iter)->value_str, 1)) {
                    return 0;
                }
            } else {
                /* node's value is supposed to match with one of the default values */
                for (i = 0; i < dflts_size; i++) {
                    if (ly_strequal(dflts[i], ((struct lyd_node_leaf_list *)iter)->value_str, 1)) {
                        break;
                    }
                }
                if (i == dflts_size) {
                    /* values do not match */
                    return 0;
                }
            }
            c++;
        }
        if (c != dflts_size) {
            /* different sets of leaf-list instances */
            return 0;
        }
    } else {
        return 0;
    }

    /* all checks ok */
    return 1;
}